

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O3

CircularListElement<HACD::TMMTriangle> * __thiscall
HACD::ICHUll::MakeConeFace
          (ICHUll *this,CircularListElement<HACD::TMMEdge> *e,
          CircularListElement<HACD::TMMVertex> *p)

{
  bool bVar1;
  CircularListElement<HACD::TMMEdge> *pCVar2;
  CircularListElement<HACD::TMMTriangle> *f;
  bool bVar3;
  ICHUll *this_00;
  CircularListElement<HACD::TMMEdge> **ppCVar4;
  long lVar5;
  CircularListElement<HACD::TMMEdge> *newEdges [2];
  CircularListElement<HACD::TMMEdge> *local_48;
  CircularListElement<HACD::TMMEdge> *apCStack_40 [2];
  
  lVar5 = 0;
  ppCVar4 = &local_48;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    pCVar2 = ((e->m_data).m_vertices[lVar5]->m_data).m_duplicate;
    *ppCVar4 = pCVar2;
    if (pCVar2 == (CircularListElement<HACD::TMMEdge> *)0x0) {
      pCVar2 = CircularList<HACD::TMMEdge>::Add(&(this->m_mesh).m_edges,(TMMEdge *)0x0);
      *ppCVar4 = pCVar2;
      (pCVar2->m_data).m_vertices[0] = (e->m_data).m_vertices[lVar5];
      (pCVar2->m_data).m_vertices[1] = p;
      ((e->m_data).m_vertices[lVar5]->m_data).m_duplicate = pCVar2;
    }
    lVar5 = 1;
    ppCVar4 = apCStack_40;
    bVar1 = false;
  } while (bVar3);
  this_00 = (ICHUll *)&(this->m_mesh).m_triangles;
  f = CircularList<HACD::TMMTriangle>::Add
                ((CircularList<HACD::TMMTriangle> *)this_00,(TMMTriangle *)0x0);
  (f->m_data).m_edges[0] = e;
  (f->m_data).m_edges[1] = local_48;
  (f->m_data).m_edges[2] = apCStack_40[0];
  MakeCCW(this_00,f,e,p);
  ppCVar4 = &local_48;
  bVar1 = true;
  do {
    pCVar2 = *ppCVar4;
    if ((pCVar2->m_data).m_triangles[0] == (CircularListElement<HACD::TMMTriangle> *)0x0) {
      lVar5 = 0;
LAB_00849913:
      (pCVar2->m_data).m_triangles[lVar5] = f;
    }
    else if ((pCVar2->m_data).m_triangles[1] == (CircularListElement<HACD::TMMTriangle> *)0x0) {
      lVar5 = 1;
      goto LAB_00849913;
    }
    bVar3 = !bVar1;
    ppCVar4 = apCStack_40;
    bVar1 = false;
    if (bVar3) {
      return f;
    }
  } while( true );
}

Assistant:

CircularListElement<TMMTriangle> * ICHUll::MakeConeFace(CircularListElement<TMMEdge> * e, CircularListElement<TMMVertex> * p)
	{
        // create two new edges if they don't already exist
        CircularListElement<TMMEdge> * newEdges[2];
        for(int i = 0; i < 2; ++i)
        {
            if ( !( newEdges[i] = e->GetData().m_vertices[i]->GetData().m_duplicate ) )  
            { // if the edge doesn't exits add it and mark the vertex as duplicated
                newEdges[i] = m_mesh.AddEdge();
                newEdges[i]->GetData().m_vertices[0] = e->GetData().m_vertices[i];
                newEdges[i]->GetData().m_vertices[1] = p;
                e->GetData().m_vertices[i]->GetData().m_duplicate = newEdges[i];
            }
        }
        // make the new face
        CircularListElement<TMMTriangle> * newFace = m_mesh.AddTriangle();
        newFace->GetData().m_edges[0] = e;
        newFace->GetData().m_edges[1] = newEdges[0];
        newFace->GetData().m_edges[2] = newEdges[1];
        MakeCCW(newFace, e, p);
        for(int i=0; i < 2; ++i)
        {
            for(int j=0; j < 2; ++j)
            {
                if ( ! newEdges[i]->GetData().m_triangles[j] )
                {
                    newEdges[i]->GetData().m_triangles[j] = newFace;
                    break;
                }
            }
        }
		return newFace;
	}